

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall
lest::to_string<unsigned_long,unsigned_int>
          (string *__return_storage_ptr__,lest *this,unsigned_long *lhs,string *op,uint *rhs)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  ostringstream os;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  string local_1d0;
  uint local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_210 = *(long **)this;
  make_value_string<unsigned_long>(&local_1d0,(unsigned_long *)&local_210);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_1e0 = *plVar3;
    lStack_1d8 = plVar1[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar3;
    local_1f0 = (long *)*plVar1;
  }
  local_1e8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*lhs,lhs[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_1ac = *(uint *)&(op->_M_dataplus)._M_p;
  make_value_string<unsigned_int>(&local_1d0,&local_1ac);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_200 = *plVar3;
    lStack_1f8 = plVar1[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *plVar3;
    local_210 = (long *)*plVar1;
  }
  local_208 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_210,local_208);
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}